

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseExpectedValue
          (JSONParser *this,ExpectedValue *out_value,AllowExpected allow_expected)

{
  string_view value_str_00;
  string_view value_str_01;
  Result RVar1;
  int iVar2;
  undefined4 extraout_var;
  Enum EVar3;
  int lane;
  uint lane_00;
  Type lane_type;
  Type type;
  string value_str;
  Type local_60;
  Type local_5c;
  undefined8 local_58;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  RVar1 = Expect(this,"{");
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ExpectKey(this,"type");
    if (RVar1.enum_ != Error) {
      RVar1 = ParseType(this,&local_5c);
      if (RVar1.enum_ != Error) {
        RVar1 = Expect(this,",");
        if (RVar1.enum_ != Error) {
          if (local_5c.enum_ == V128) {
            RVar1 = ExpectKey(this,"lane_type");
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            RVar1 = ParseType(this,&local_60);
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            RVar1 = Expect(this,",");
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            RVar1 = ExpectKey(this,"value");
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            RVar1 = Expect(this,"[");
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            iVar2 = LaneCountFromType(local_60);
            local_58 = CONCAT44(extraout_var,iVar2);
            lane_00 = 0;
            do {
              RVar1 = ParseString(this,&local_50);
              if (RVar1.enum_ == Error) goto LAB_0016cd9e;
              value_str_00.size_ = local_50._M_string_length;
              value_str_00.data_ = local_50._M_dataplus._M_p;
              RVar1 = ParseLaneConstValue(this,local_60,lane_00,out_value,value_str_00,
                                          allow_expected);
              if (RVar1.enum_ == Error) goto LAB_0016cd9e;
              if (lane_00 < iVar2 - 1U) {
                RVar1 = Expect(this,",");
                if (RVar1.enum_ == Error) goto LAB_0016cd9e;
              }
              lane_00 = lane_00 + 1;
            } while ((uint)local_58 != lane_00);
            RVar1 = Expect(this,"]");
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            (out_value->value).type.enum_ = V128;
            (out_value->lane_type).enum_ = local_60.enum_;
          }
          else {
            RVar1 = ParseKeyStringValue(this,"value",&local_50);
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            value_str_01.size_ = local_50._M_string_length;
            value_str_01.data_ = local_50._M_dataplus._M_p;
            RVar1 = ParseConstValue(this,local_5c,&(out_value->value).value,out_value->nan,
                                    value_str_01,allow_expected);
            if (RVar1.enum_ == Error) goto LAB_0016cd9e;
            (out_value->value).type.enum_ = local_5c.enum_;
          }
          RVar1 = Expect(this,"}");
          EVar3 = (Enum)(RVar1.enum_ == Error);
        }
      }
    }
  }
LAB_0016cd9e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValue(ExpectedValue* out_value,
                                            AllowExpected allow_expected) {
  Type type;
  std::string value_str;
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(&type));
  EXPECT(",");
  if (type == Type::V128) {
    Type lane_type;
    EXPECT_KEY("lane_type");
    CHECK_RESULT(ParseType(&lane_type));
    EXPECT(",");
    EXPECT_KEY("value");
    EXPECT("[");

    int lane_count = LaneCountFromType(lane_type);
    for (int lane = 0; lane < lane_count; ++lane) {
      CHECK_RESULT(ParseString(&value_str));
      CHECK_RESULT(ParseLaneConstValue(lane_type, lane, out_value, value_str,
                                       allow_expected));
      if (lane < lane_count - 1) {
        EXPECT(",");
      }
    }
    EXPECT("]");
    out_value->value.type = type;
    out_value->lane_type = lane_type;
  } else {
    PARSE_KEY_STRING_VALUE("value", &value_str);
    CHECK_RESULT(ParseConstValue(type, &out_value->value.value,
                                 &out_value->nan[0], value_str,
                                 allow_expected));
    out_value->value.type = type;
  }
  EXPECT("}");

  return wabt::Result::Ok;
}